

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_cheat.cpp
# Opt level: O2

void cht_Suicide(player_t *plyr)

{
  DSuicider *this;
  APlayerPawn *pointed;
  
  if (plyr->mo != (APlayerPawn *)0x0) {
    this = (DSuicider *)DObject::operator_new(0x40);
    DSuicider::DSuicider(this);
    (this->Pawn).field_0 = (anon_union_8_2_947301c2_for_TObjPtr<APlayerPawn>_1)plyr->mo;
    pointed = GC::ReadBarrier<APlayerPawn>((APlayerPawn **)&this->Pawn);
    if (((pointed != (APlayerPawn *)0x0) &&
        (((pointed->super_AActor).super_DThinker.super_DObject.ObjectFlags & 3) != 0)) &&
       (((this->super_DThinker).super_DObject.ObjectFlags & 4) != 0)) {
      GC::Barrier((DObject *)this,(DObject *)pointed);
      return;
    }
  }
  return;
}

Assistant:

void cht_Suicide (player_t *plyr)
{
	// If this cheat was initiated by the suicide ccmd, and this is a single
	// player game, the CHT_SUICIDE will be processed before the tic is run,
	// so the console has not gone up yet. Use a temporary thinker to delay
	// the suicide until the game ticks so that death noises can be heard on
	// the initial tick.
	if (plyr->mo != NULL)
	{
		DSuicider *suicide = new DSuicider;
		suicide->Pawn = plyr->mo;
		GC::WriteBarrier(suicide, suicide->Pawn);
	}
}